

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

DirPathPair * __thiscall
capnp::compiler::CompilerMain::interpretSourceFile
          (DirPathPair *__return_storage_ptr__,CompilerMain *this,StringPtr pathStr)

{
  OutputDirective *pOVar1;
  ProcessContext *pPVar2;
  PathPtr prefix;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Maybe<capnp::compiler::CompilerMain::SourceDirectory_&> MVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char (*params_1) [197];
  size_t extraout_RDX;
  void *__child_stack;
  ArrayPtr<const_char> *extraout_RDX_00;
  ArrayPtr<const_char> *params;
  ArrayPtr<const_char> *extraout_RDX_01;
  String *pSVar6;
  void *in_R8;
  long lVar7;
  long lVar8;
  OutputDirective *this_00;
  Path path;
  PathPtr remainder;
  Fault f;
  PathPtr cwd;
  StringPtr local_50;
  StringPtr pathStr_local;
  
  params_1 = (char (*) [197])pathStr.content.size_;
  pathStr_local.content.ptr = pathStr.content.ptr;
  pathStr_local.content.size_ = (size_t)params_1;
  iVar4 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  cwd.parts.ptr = (String *)CONCAT44(extraout_var,iVar4);
  cwd.parts.size_ = extraout_RDX;
  kj::PathPtr::eval(&path,&cwd,pathStr);
  if (path.parts.size_ == 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x768,FAILED,"path.size() > 0","");
    kj::_::Debug::Fault::fatal(&f);
  }
  lVar8 = -path.parts.size_;
  lVar7 = path.parts.size_ * 0x18;
  do {
    lVar8 = lVar8 + 1;
    if (lVar8 == 0) {
      prefix.parts.size_ = cwd.parts.size_;
      prefix.parts.ptr = cwd.parts.ptr;
      bVar3 = kj::Path::startsWith(&path,prefix);
      if (bVar3) {
        iVar4 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
        __return_storage_ptr__->dir = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar4);
        f.exception = (Exception *)(path.parts.ptr + cwd.parts.size_);
        kj::PathPtr::clone((PathPtr *)&__return_storage_ptr__->path,(__fn *)&f,f.exception,
                           (int)path.parts.size_ - (int)cwd.parts.size_,in_R8);
        goto LAB_001e02a1;
      }
      this_00 = (this->outputs).builder.ptr;
      pOVar1 = (this->outputs).builder.pos;
      params = extraout_RDX_00;
      goto LAB_001e01ab;
    }
    f.exception = (Exception *)path.parts.ptr;
    remainder.parts.ptr = (String *)((long)&path.parts.ptr[-1].content.ptr + lVar7);
    params_1 = (char (*) [197])(path.parts.size_ + lVar8);
    remainder.parts.size_ = (size_t)params_1;
    MVar5 = kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::find<kj::PathPtr&>
                      ((HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory> *)
                       &this->sourceDirectories,(PathPtr *)&f);
    lVar7 = lVar7 + -0x18;
  } while (MVar5.ptr == (SourceDirectory *)0x0);
  __return_storage_ptr__->dir = ((MVar5.ptr)->dir).ptr;
  kj::PathPtr::clone((PathPtr *)&__return_storage_ptr__->path,(__fn *)&remainder,__child_stack,
                     (int)params_1,in_R8);
LAB_001e02a1:
  kj::Array<kj::String>::~Array(&path.parts);
  return __return_storage_ptr__;
LAB_001e01ab:
  if (this_00 == pOVar1) goto LAB_001e0269;
  kj::str<kj::ArrayPtr<char_const>&>((String *)&f,(kj *)this_00,params);
  remainder.parts.ptr = (String *)0x2b00fe;
  remainder.parts.size_ = 2;
  bVar3 = kj::String::operator!=((String *)&f,(StringPtr *)&remainder);
  if (bVar3) {
    local_50.content.ptr = "capnp";
    local_50.content.size_ = 6;
    bVar3 = kj::String::operator!=((String *)&f,&local_50);
    if (bVar3) {
      pPVar2 = this->context;
      kj::str<kj::StringPtr&,char_const(&)[197]>
                ((String *)&remainder,(kj *)&pathStr_local,
                 (StringPtr *)
                 ": File is not in the current directory and does not match any prefix defined with --src-prefix. Please pass an appropriate --src-prefix so I can figure out where to write the output for this file."
                 ,params_1);
      pSVar6 = remainder.parts.ptr;
      if (remainder.parts.size_ == 0) {
        pSVar6 = (String *)0x2b02ed;
      }
      (*pPVar2->_vptr_ProcessContext[2])
                (pPVar2,pSVar6,remainder.parts.size_ + (remainder.parts.size_ == 0));
      kj::Array<char>::~Array((Array<char> *)&remainder);
      kj::Array<char>::~Array((Array<char> *)&f);
      goto LAB_001e0269;
    }
  }
  kj::Array<char>::~Array((Array<char> *)&f);
  this_00 = this_00 + 1;
  params = extraout_RDX_01;
  goto LAB_001e01ab;
LAB_001e0269:
  iVar4 = (**((this->disk).ptr)->_vptr_Filesystem)();
  __return_storage_ptr__->dir = (ReadableDirectory *)CONCAT44(extraout_var_01,iVar4);
  (__return_storage_ptr__->path).parts.ptr = path.parts.ptr;
  (__return_storage_ptr__->path).parts.size_ = path.parts.size_;
  (__return_storage_ptr__->path).parts.disposer = path.parts.disposer;
  path.parts.ptr = (String *)0x0;
  path.parts.size_ = 0;
  goto LAB_001e02a1;
}

Assistant:

DirPathPair interpretSourceFile(kj::StringPtr pathStr) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    KJ_REQUIRE(path.size() > 0);
    for (size_t i = path.size() - 1; i > 0; i--) {
      auto prefix = path.slice(0, i);
      auto remainder = path.slice(i, path.size());

      KJ_IF_MAYBE(sdir, sourceDirectories.find(prefix)) {
        return { *sdir->dir, remainder.clone() };
      }
    }

    // No source prefix matched. Fall back to heuristic: try stripping the current directory,
    // otherwise don't strip anything.
    if (path.startsWith(cwd)) {
      return { disk->getCurrent(), path.slice(cwd.size(), path.size()).clone() };
    } else {
      // Hmm, no src-prefix matched and the file isn't even in the current directory. This might
      // be OK if we aren't generating any output anyway, but otherwise the results will almost
      // certainly not be what the user wanted. Let's print a warning, unless the output directives
      // are ones which we know do not produce output files. This is a hack.
      for (auto& output: outputs) {
        auto name = kj::str(output.name);
        if (name != "-" && name != "capnp") {
          context.warning(kj::str(pathStr,
              ": File is not in the current directory and does not match any prefix defined with "
              "--src-prefix. Please pass an appropriate --src-prefix so I can figure out where to "
              "write the output for this file."));
          break;
        }
      }

      return { disk->getRoot(), kj::mv(path) };
    }
  }